

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncOutput(xmlOutputBufferPtr output,int init)

{
  xmlBufPtr buf;
  xmlCharEncodingHandler *pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *in_00;
  size_t sVar4;
  int charrefLen;
  int cur;
  xmlChar *content;
  uchar local_68 [4];
  int len;
  xmlChar charref [20];
  xmlBufPtr out;
  xmlBufPtr in;
  int c_out;
  int c_in;
  size_t toconv;
  size_t sStack_28;
  int writtentot;
  size_t written;
  int ret;
  int init_local;
  xmlOutputBufferPtr output_local;
  
  toconv._4_4_ = 0;
  if ((((output == (xmlOutputBufferPtr)0x0) || (output->encoder == (xmlCharEncodingHandlerPtr)0x0))
      || (output->buffer == (xmlBufPtr)0x0)) || (output->conv == (xmlBufPtr)0x0)) {
    return -1;
  }
  unique0x00012000 = output->conv;
  buf = output->buffer;
  written._4_4_ = init;
  _ret = output;
LAB_0012fd25:
  do {
    sStack_28 = xmlBufAvail(stack0xffffffffffffffb0);
    if (written._4_4_ != 0) {
      in._4_4_ = 0;
      in._0_4_ = (int)sStack_28;
      pxVar1 = _ret->encoder;
      pxVar3 = xmlBufEnd(stack0xffffffffffffffb0);
      xmlEncOutputChunk(pxVar1,pxVar3,(int *)&in,(uchar *)0x0,(int *)((long)&in + 4));
      xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
      return (int)in;
    }
    _c_out = xmlBufUse(buf);
    if (0x10000 < _c_out) {
      _c_out = 0x10000;
    }
    if (sStack_28 <= _c_out << 2) {
      iVar2 = xmlBufGrow(stack0xffffffffffffffb0,_c_out << 2);
      if (iVar2 < 0) {
        written._0_4_ = -4;
        goto LAB_0012ff66;
      }
      sStack_28 = xmlBufAvail(stack0xffffffffffffffb0);
    }
    if (0x40000 < sStack_28) {
      sStack_28 = 0x40000;
    }
    in._4_4_ = (int)_c_out;
    in._0_4_ = (int)sStack_28;
    pxVar1 = _ret->encoder;
    pxVar3 = xmlBufEnd(stack0xffffffffffffffb0);
    in_00 = xmlBufContent(buf);
    written._0_4_ = xmlEncOutputChunk(pxVar1,pxVar3,(int *)&in,in_00,(int *)((long)&in + 4));
    xmlBufShrink(buf,(long)in._4_4_);
    xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
    toconv._4_4_ = (int)in + toconv._4_4_;
  } while ((int)written == -3);
  if ((int)written == -2) {
    sVar4 = xmlBufUse(buf);
    content._4_4_ = (int)sVar4;
    pxVar3 = xmlBufContent(buf);
    iVar2 = xmlGetUTF8Char(pxVar3,(int *)((long)&content + 4));
    if (0 < iVar2) {
      iVar2 = xmlSerializeDecCharRef((char *)local_68,iVar2);
      xmlBufGrow(stack0xffffffffffffffb0,(long)(iVar2 << 2));
      sVar4 = xmlBufAvail(stack0xffffffffffffffb0);
      in._0_4_ = (int)sVar4;
      pxVar1 = _ret->encoder;
      in._4_4_ = iVar2;
      pxVar3 = xmlBufEnd(stack0xffffffffffffffb0);
      written._0_4_ = xmlEncOutputChunk(pxVar1,pxVar3,(int *)&in,local_68,(int *)((long)&in + 4));
      if ((-1 < (int)written) && (in._4_4_ == iVar2)) {
        xmlBufShrink(buf,(long)content._4_4_);
        xmlBufAddLen(stack0xffffffffffffffb0,(long)(int)in);
        toconv._4_4_ = (int)in + toconv._4_4_;
        goto LAB_0012fd25;
      }
      written._0_4_ = -1;
    }
  }
LAB_0012ff66:
  if (((0 < toconv._4_4_) || ((int)written == 0)) && ((int)written != -4)) {
    return toconv._4_4_;
  }
  if (_ret->error == 0) {
    iVar2 = xmlEncConvertError((int)written);
    _ret->error = iVar2;
  }
  return (int)written;
}

Assistant:

int
xmlCharEncOutput(xmlOutputBufferPtr output, int init)
{
    int ret;
    size_t written;
    int writtentot = 0;
    size_t toconv;
    int c_in;
    int c_out;
    xmlBufPtr in;
    xmlBufPtr out;

    if ((output == NULL) || (output->encoder == NULL) ||
        (output->buffer == NULL) || (output->conv == NULL))
        return(XML_ENC_ERR_INTERNAL);
    out = output->conv;
    in = output->buffer;

retry:

    written = xmlBufAvail(out);

    /*
     * First specific handling of the initialization call
     */
    if (init) {
        c_in = 0;
        c_out = written;
        /* TODO: Check return value. */
        xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                          NULL, &c_in);
        xmlBufAddLen(out, c_out);
        return(c_out);
    }

    /*
     * Conversion itself.
     */
    toconv = xmlBufUse(in);
    if (toconv > 64 * 1024)
        toconv = 64 * 1024;
    if (toconv * 4 >= written) {
        if (xmlBufGrow(out, toconv * 4) < 0) {
            ret = XML_ENC_ERR_MEMORY;
            goto error;
        }
        written = xmlBufAvail(out);
    }
    if (written > 256 * 1024)
        written = 256 * 1024;

    c_in = toconv;
    c_out = written;
    ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                            xmlBufContent(in), &c_in);
    xmlBufShrink(in, c_in);
    xmlBufAddLen(out, c_out);
    writtentot += c_out;

    if (ret == XML_ENC_ERR_SPACE)
        goto retry;

    /*
     * Attempt to handle error cases
     */
    if (ret == XML_ENC_ERR_INPUT) {
        xmlChar charref[20];
        int len = xmlBufUse(in);
        xmlChar *content = xmlBufContent(in);
        int cur, charrefLen;

        cur = xmlGetUTF8Char(content, &len);
        if (cur <= 0)
            goto error;

        /*
         * Removes the UTF8 sequence, and replace it by a charref
         * and continue the transcoding phase, hoping the error
         * did not mangle the encoder state.
         */
        charrefLen = xmlSerializeDecCharRef((char *) charref, cur);
        xmlBufGrow(out, charrefLen * 4);
        c_out = xmlBufAvail(out);
        c_in = charrefLen;
        ret = xmlEncOutputChunk(output->encoder, xmlBufEnd(out), &c_out,
                                charref, &c_in);
        if ((ret < 0) || (c_in != charrefLen)) {
            ret = XML_ENC_ERR_INTERNAL;
            goto error;
        }

        xmlBufShrink(in, len);
        xmlBufAddLen(out, c_out);
        writtentot += c_out;
        goto retry;
    }

error:
    if (((writtentot <= 0) && (ret != 0)) ||
        (ret == XML_ENC_ERR_MEMORY)) {
        if (output->error == 0)
            output->error = xmlEncConvertError(ret);
        return(ret);
    }

    return(writtentot);
}